

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

iterator __thiscall
QMultiMap<QString,_QString>::insert(QMultiMap<QString,_QString> *this,QString *key,QString *value)

{
  QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
  *pQVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  pair<const_QString,_QString> pStack_68;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
  local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.ptr =
       (totally_ordered_wrapper<QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_38.d.ptr ==
       (QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
           *)local_38.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_38.d.ptr =
         (totally_ordered_wrapper<QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_*>
          )(QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
       *)local_38.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
                        *)local_38.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  iVar2 = std::
          _Rb_tree<QString,_std::pair<const_QString,_QString>,_std::_Select1st<std::pair<const_QString,_QString>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>
          ::lower_bound(&(((this->d).d.ptr)->m)._M_t,key);
  pQVar1 = (this->d).d.ptr;
  std::pair<const_QString,_QString>::pair<const_QString,_QString,_true>(&pStack_68,key,value);
  iVar2 = std::
          _Rb_tree<QString,std::pair<QString_const,QString>,std::_Select1st<std::pair<QString_const,QString>>,std::less<QString>,std::allocator<std::pair<QString_const,QString>>>
          ::_M_insert_equal_<std::pair<QString_const,QString>>
                    ((_Rb_tree<QString,std::pair<QString_const,QString>,std::_Select1st<std::pair<QString_const,QString>>,std::less<QString>,std::allocator<std::pair<QString_const,QString>>>
                      *)&pQVar1->m,iVar2._M_node,&pStack_68);
  std::pair<const_QString,_QString>::~pair(&pStack_68);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (iterator)(iterator)iVar2._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key`/`value` alive across the detach
        detach();
        // note that std::multimap inserts at the end of an equal_range for a key,
        // QMultiMap at the beginning.
        auto i = d->m.lower_bound(key);
        return iterator(d->m.insert(i, {key, value}));
    }